

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O1

char * ngx_conf_merge_path_value
                 (ngx_conf_t *cf,ngx_path_t **path,ngx_path_t *prev,ngx_path_init_t *init)

{
  u_char *puVar1;
  ngx_path_t *pnVar2;
  ngx_int_t nVar3;
  size_t sVar4;
  long lVar5;
  
  if (*path == (ngx_path_t *)0x0) {
    if (prev == (ngx_path_t *)0x0) {
      pnVar2 = (ngx_path_t *)ngx_pcalloc(cf->pool,0x60);
      *path = pnVar2;
      if (pnVar2 == (ngx_path_t *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      puVar1 = (init->name).data;
      (pnVar2->name).len = (init->name).len;
      (pnVar2->name).data = puVar1;
      nVar3 = ngx_conf_full_name(cf->cycle,&(*path)->name,0);
      if (nVar3 != 0) {
        return (char *)0xffffffffffffffff;
      }
      pnVar2 = *path;
      sVar4 = pnVar2->len;
      lVar5 = 0;
      do {
        pnVar2->level[lVar5] = init->level[lVar5];
        sVar4 = (sVar4 + init->level[lVar5] + 1) - (ulong)(init->level[lVar5] == 0);
        pnVar2->len = sVar4;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      nVar3 = ngx_add_path(cf,path);
      return (char *)-(ulong)(nVar3 != 0);
    }
    *path = prev;
  }
  return (char *)0x0;
}

Assistant:

char *
ngx_conf_merge_path_value(ngx_conf_t *cf, ngx_path_t **path, ngx_path_t *prev,
    ngx_path_init_t *init)
{
    ngx_uint_t  i;

    if (*path) {
        return NGX_CONF_OK;
    }

    if (prev) {
        *path = prev;
        return NGX_CONF_OK;
    }

    *path = ngx_pcalloc(cf->pool, sizeof(ngx_path_t));
    if (*path == NULL) {
        return NGX_CONF_ERROR;
    }

    (*path)->name = init->name;

    if (ngx_conf_full_name(cf->cycle, &(*path)->name, 0) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; i < NGX_MAX_PATH_LEVEL; i++) {
        (*path)->level[i] = init->level[i];
        (*path)->len += init->level[i] + (init->level[i] ? 1 : 0);
    }

    if (ngx_add_path(cf, path) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}